

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::LessThanLayerParams::_InternalParse
          (LessThanLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32_t tag;
  float *local_40;
  uint local_34;
  
  local_40 = (float *)ptr;
  while( true ) {
    while( true ) {
      bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_40);
      if (bVar1) {
        return (char *)local_40;
      }
      local_40 = (float *)google::protobuf::internal::ReadTag((char *)local_40,&local_34,0);
      tag_00 = local_34;
      if (local_34 != 0x15) break;
      this->alpha_ = *local_40;
      local_40 = local_40 + 1;
    }
    if ((local_34 == 0) || ((local_34 & 7) == 4)) break;
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>
                        (&(this->super_MessageLite)._internal_metadata_);
    local_40 = (float *)google::protobuf::internal::UnknownFieldParse
                                  (tag_00,unknown,(char *)local_40,ctx);
    if (local_40 == (float *)0x0) {
      return (char *)0x0;
    }
  }
  if (local_40 == (float *)0x0) {
    return (char *)0x0;
  }
  (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
  return (char *)local_40;
}

Assistant:

const char* LessThanLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // float alpha = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          alpha_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}